

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParseObjectInit(Parse *pParse,sqlite3 *db)

{
  sqlite3 *db_local;
  Parse *pParse_local;
  
  memset(&pParse->zErrMsg,0,0xd0);
  memset(&pParse->sLastToken,0,0x88);
  pParse->pOuterParse = db->pParse;
  db->pParse = pParse;
  pParse->db = db;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParseObjectInit(Parse *pParse, sqlite3 *db){
  memset(PARSE_HDR(pParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  assert( db->pParse!=pParse );
  pParse->pOuterParse = db->pParse;
  db->pParse = pParse;
  pParse->db = db;
  if( db->mallocFailed ) sqlite3ErrorMsg(pParse, "out of memory");
}